

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

int anon_unknown.dwarf_e7629::ParseInteger(ExpressionContext *ctx,char *str)

{
  int local_20;
  int a;
  uint digit;
  char *str_local;
  ExpressionContext *ctx_local;
  
  local_20 = 0;
  for (_a = str; (int)*_a - 0x30U < 10; _a = _a + 1) {
    local_20 = local_20 * 10 + ((int)*_a - 0x30U);
  }
  return local_20;
}

Assistant:

int ParseInteger(ExpressionContext &ctx, const char* str)
	{
		(void)ctx;

		unsigned digit;
		int a = 0;

		while((digit = *str - '0') < 10)
		{
			a = a * 10 + digit;
			str++;
		}

		return a;
	}